

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O2

HFFilteredConsumer * __thiscall
MlmWrap::createFilteredConsumer
          (MlmWrap *this,HighFreqDataType *dt,size_t buffersize,hfs_data_filter_fn *filter,
          HFParsingInfo *parser)

{
  SubType SVar1;
  HFFilteredConsumer *this_00;
  HFParsingInfo local_2e0;
  HighFreqDataType local_2a0;
  HFSubSockSettings local_210;
  HFSubSockSettings local_168;
  HighFreqDataType local_c0;
  
  this_00 = (HFFilteredConsumer *)operator_new(0x420);
  HighFreqDataType::HighFreqDataType(&local_2a0,dt);
  HFParsingInfo::HFParsingInfo(&local_2e0,parser);
  HFFilteredConsumer::HFFilteredConsumer(this_00,&local_2a0,(int)buffersize,filter,&local_2e0);
  HFParsingInfo::~HFParsingInfo(&local_2e0);
  HighFreqDataType::~HighFreqDataType(&local_2a0);
  addSubToList(this,(HighFreqSub *)this_00);
  HighFreqDataType::HighFreqDataType(&local_c0,dt);
  SVar1 = (this_00->super_HFSubConsumer).super_HighFreqSub.sockType;
  HighFreqDataType::HighFreqDataType(&local_168.dataType,&local_c0);
  local_168.userFoo = (hfs_data_callback_fn)0x0;
  local_168.args = (void *)0x0;
  local_168.subSockType = SVar1;
  HighFreqDataType::~HighFreqDataType(&local_c0);
  HFSubSockSettings::HFSubSockSettings(&local_210,&local_168);
  addHfTypeToSubbedList(this,&local_210);
  HighFreqDataType::~HighFreqDataType(&local_210.dataType);
  HighFreqDataType::~HighFreqDataType(&local_168.dataType);
  return this_00;
}

Assistant:

HFFilteredConsumer* MlmWrap::createFilteredConsumer(HighFreqDataType dt, size_t buffersize, hfs_data_filter_fn* filter, HFParsingInfo parser){
    HFFilteredConsumer *newsub = new HFFilteredConsumer(dt, buffersize, filter, parser);
    addSubToList(newsub);
    HFSubSockSettings sockInfo(dt, newsub->getSubSockType(), NULL, NULL);
    addHfTypeToSubbedList(sockInfo);
    return newsub;
}